

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O1

STAmount * jbcoin::operator+(STAmount *__return_storage_ptr__,STAmount *v1,STAmount *v2)

{
  bool bVar1;
  exponent_type eVar2;
  int iVar3;
  mantissa_type mVar4;
  SField *pSVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  mantissa_type mVar11;
  mantissa_type mVar12;
  int iVar13;
  int iVar14;
  
  if (v1->mIsNative == v2->mIsNative) {
    lVar10 = 0;
    do {
      if (*(char *)((long)(v1->mIssue).currency.pn + lVar10) !=
          *(char *)((long)(v2->mIssue).currency.pn + lVar10)) goto LAB_001b07eb;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x14);
    lVar10 = 0x14;
LAB_001b07eb:
    if (lVar10 == 0x14) {
      mVar4 = v2->mValue;
      if (mVar4 == 0) {
        (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d6fc0;
        (__return_storage_ptr__->super_STBase).fName = (v1->super_STBase).fName;
        (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d6f40;
        uVar6 = *(undefined8 *)((v1->mIssue).currency.pn + 2);
        uVar7 = *(undefined8 *)((v1->mIssue).currency.pn + 4);
        uVar8 = *(undefined8 *)((v1->mIssue).account.pn + 1);
        uVar9 = *(undefined8 *)((v1->mIssue).account.pn + 3);
        mVar4 = v1->mValue;
        *(undefined8 *)(__return_storage_ptr__->mIssue).currency.pn =
             *(undefined8 *)(v1->mIssue).currency.pn;
        *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 2) = uVar6;
        *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = uVar7;
        *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 1) = uVar8;
        *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 3) = uVar9;
        __return_storage_ptr__->mValue = mVar4;
        *(undefined8 *)((long)&__return_storage_ptr__->mValue + 6) =
             *(undefined8 *)((long)&v1->mValue + 6);
        return __return_storage_ptr__;
      }
      mVar11 = v1->mValue;
      if (mVar11 == 0) {
        eVar2 = v2->mOffset;
        bVar1 = v2->mIsNegative;
        (__return_storage_ptr__->super_STBase).fName = (v1->super_STBase).fName;
        (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d6f40;
        uVar6 = *(undefined8 *)((v1->mIssue).currency.pn + 2);
        uVar7 = *(undefined8 *)((v1->mIssue).currency.pn + 4);
        uVar8 = *(undefined8 *)((v1->mIssue).account.pn + 1);
        *(undefined8 *)(__return_storage_ptr__->mIssue).currency.pn =
             *(undefined8 *)(v1->mIssue).currency.pn;
        *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 2) = uVar6;
        *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = uVar7;
        *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 1) = uVar8;
        *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 3) =
             *(undefined8 *)((v1->mIssue).account.pn + 3);
        __return_storage_ptr__->mValue = mVar4;
        __return_storage_ptr__->mOffset = eVar2;
        __return_storage_ptr__->mIsNegative = bVar1;
      }
      else {
        if (v1->mIsNative != false) {
          if (v2->mIsNative != false) {
            mVar12 = -mVar11;
            if (v1->mIsNegative == false) {
              mVar12 = mVar11;
            }
            mVar11 = -mVar4;
            if (v2->mIsNegative == false) {
              mVar11 = mVar4;
            }
            mVar11 = mVar11 + mVar12;
            (__return_storage_ptr__->super_STBase).fName = (v1->super_STBase).fName;
            (__return_storage_ptr__->super_STBase)._vptr_STBase =
                 (_func_int **)&PTR__STBase_002d6f40;
            (__return_storage_ptr__->mIssue).currency.pn[0] = 0;
            (__return_storage_ptr__->mIssue).currency.pn[1] = 0;
            (__return_storage_ptr__->mIssue).currency.pn[2] = 0;
            (__return_storage_ptr__->mIssue).currency.pn[3] = 0;
            *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = 0;
            (__return_storage_ptr__->mIssue).account.pn[1] = 0;
            (__return_storage_ptr__->mIssue).account.pn[2] = 0;
            (__return_storage_ptr__->mIssue).account.pn[3] = 0;
            (__return_storage_ptr__->mIssue).account.pn[4] = 0;
            __return_storage_ptr__->mOffset = 0;
            __return_storage_ptr__->mIsNative = true;
            if ((long)mVar11 < 0) {
              __return_storage_ptr__->mIsNegative = true;
              mVar11 = -mVar11;
            }
            else {
              __return_storage_ptr__->mIsNegative = false;
            }
            __return_storage_ptr__->mValue = mVar11;
            return __return_storage_ptr__;
          }
          Throw<std::runtime_error,char_const(&)[22]>((char (*) [22])"amount is not native!");
        }
        iVar13 = v1->mOffset;
        mVar12 = -mVar11;
        if (v1->mIsNegative == false) {
          mVar12 = mVar11;
        }
        mVar11 = -mVar4;
        if (v2->mIsNegative == false) {
          mVar11 = mVar4;
        }
        iVar3 = v2->mOffset;
        iVar14 = iVar3 - iVar13;
        if (iVar14 != 0 && iVar13 <= iVar3) {
          do {
            mVar12 = (long)mVar12 / 10;
            iVar14 = iVar14 + -1;
            iVar13 = iVar3;
          } while (iVar14 != 0);
        }
        iVar14 = iVar13 - iVar3;
        if (iVar14 != 0 && iVar3 <= iVar13) {
          do {
            mVar11 = (long)mVar11 / 10;
            iVar14 = iVar14 + -1;
          } while (iVar14 != 0);
        }
        if (mVar11 + mVar12 + 10 < 0x15) {
          (__return_storage_ptr__->super_STBase).fName = (v1->super_STBase).fName;
          (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d6f40;
          uVar6 = *(undefined8 *)((v1->mIssue).currency.pn + 2);
          uVar7 = *(undefined8 *)((v1->mIssue).currency.pn + 4);
          uVar8 = *(undefined8 *)((v1->mIssue).account.pn + 1);
          *(undefined8 *)(__return_storage_ptr__->mIssue).currency.pn =
               *(undefined8 *)(v1->mIssue).currency.pn;
          *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 2) = uVar6;
          *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = uVar7;
          *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 1) = uVar8;
          *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 3) =
               *(undefined8 *)((v1->mIssue).account.pn + 3);
          __return_storage_ptr__->mValue = 0;
          __return_storage_ptr__->mOffset = 0;
        }
        else {
          mVar11 = mVar11 + mVar12;
          pSVar5 = (v1->super_STBase).fName;
          if ((long)mVar11 < 0) {
            (__return_storage_ptr__->super_STBase).fName = pSVar5;
            (__return_storage_ptr__->super_STBase)._vptr_STBase =
                 (_func_int **)&PTR__STBase_002d6f40;
            uVar6 = *(undefined8 *)((v1->mIssue).currency.pn + 2);
            uVar7 = *(undefined8 *)((v1->mIssue).currency.pn + 4);
            uVar8 = *(undefined8 *)((v1->mIssue).account.pn + 1);
            *(undefined8 *)(__return_storage_ptr__->mIssue).currency.pn =
                 *(undefined8 *)(v1->mIssue).currency.pn;
            *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 2) = uVar6;
            *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = uVar7;
            *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 1) = uVar8;
            *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 3) =
                 *(undefined8 *)((v1->mIssue).account.pn + 3);
            __return_storage_ptr__->mValue = -mVar11;
            __return_storage_ptr__->mOffset = iVar13;
            __return_storage_ptr__->mIsNegative = true;
            goto LAB_001b09fd;
          }
          (__return_storage_ptr__->super_STBase).fName = pSVar5;
          (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d6f40;
          uVar6 = *(undefined8 *)((v1->mIssue).currency.pn + 2);
          uVar7 = *(undefined8 *)((v1->mIssue).currency.pn + 4);
          uVar8 = *(undefined8 *)((v1->mIssue).account.pn + 1);
          *(undefined8 *)(__return_storage_ptr__->mIssue).currency.pn =
               *(undefined8 *)(v1->mIssue).currency.pn;
          *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 2) = uVar6;
          *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = uVar7;
          *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 1) = uVar8;
          *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 3) =
               *(undefined8 *)((v1->mIssue).account.pn + 3);
          __return_storage_ptr__->mValue = mVar11;
          __return_storage_ptr__->mOffset = iVar13;
        }
        __return_storage_ptr__->mIsNegative = false;
      }
LAB_001b09fd:
      STAmount::canonicalize(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  Throw<std::runtime_error,char_const(&)[41]>
            ((char (*) [41])"Can\'t add amounts that are\'t comparable!");
}

Assistant:

STAmount operator+ (STAmount const& v1, STAmount const& v2)
{
    if (!areComparable (v1, v2))
        Throw<std::runtime_error> ("Can't add amounts that are't comparable!");

    if (v2 == zero)
        return v1;

    if (v1 == zero)
    {
        // Result must be in terms of v1 currency and issuer.
        return { v1.getFName (), v1.issue (),
            v2.mantissa (), v2.exponent (), v2.negative () };
    }

    if (v1.native ())
        return { v1.getFName (), getSNValue (v1) + getSNValue (v2) };

    int ov1 = v1.exponent (), ov2 = v2.exponent ();
    std::int64_t vv1 = static_cast<std::int64_t>(v1.mantissa ());
    std::int64_t vv2 = static_cast<std::int64_t>(v2.mantissa ());

    if (v1.negative ())
        vv1 = -vv1;

    if (v2.negative ())
        vv2 = -vv2;

    while (ov1 < ov2)
    {
        vv1 /= 10;
        ++ov1;
    }

    while (ov2 < ov1)
    {
        vv2 /= 10;
        ++ov2;
    }

    // This addition cannot overflow an std::int64_t. It can overflow an
    // STAmount and the constructor will throw.

    std::int64_t fv = vv1 + vv2;

    if ((fv >= -10) && (fv <= 10))
        return { v1.getFName (), v1.issue () };

    if (fv >= 0)
        return STAmount { v1.getFName (), v1.issue (),
            static_cast<std::uint64_t>(fv), ov1, false };

    return STAmount { v1.getFName (), v1.issue (),
        static_cast<std::uint64_t>(-fv), ov1, true };
}